

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

string * __thiscall
polyscope::prettyPrintCount_abi_cxx11_(string *__return_storage_ptr__,polyscope *this,size_t count)

{
  unsigned_long __val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  char cVar4;
  char cVar5;
  long *plVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  size_type *psVar10;
  polyscope *ppVar11;
  ulong uVar12;
  unsigned_long uVar13;
  int iVar14;
  long lVar15;
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 in_ZMM1 [64];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string postfix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postFixes;
  char buf [50];
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [24];
  char *local_50;
  uint local_48;
  char local_40 [16];
  undefined1 extraout_var [56];
  
  if (this == (polyscope *)0x0) {
    iVar14 = 1;
  }
  else {
    auVar3 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,this);
    auVar16._0_8_ = log10(auVar3._0_8_);
    auVar16._8_56_ = extraout_var;
    auVar3 = vroundsd_avx(auVar16._0_16_,auVar16._0_16_,9);
    iVar14 = (int)(auVar3._0_8_ + 1.0);
  }
  if (iVar14 < 5) {
    cVar5 = '\x01';
    if ((polyscope *)&DAT_00000009 < this) {
      ppVar11 = this;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (ppVar11 < (polyscope *)0x64) {
          cVar5 = cVar5 + -2;
          goto LAB_001f74f7;
        }
        if (ppVar11 < (polyscope *)0x3e8) {
          cVar5 = cVar5 + -1;
          goto LAB_001f74f7;
        }
        if (ppVar11 < (polyscope *)0x2710) goto LAB_001f74f7;
        bVar2 = (polyscope *)0x1869f < ppVar11;
        ppVar11 = (polyscope *)((ulong)ppVar11 / 10000);
        cVar4 = cVar5 + '\x04';
      } while (bVar2);
      cVar5 = cVar5 + '\x01';
    }
LAB_001f74f7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p,
               (uint)__return_storage_ptr__->_M_string_length,(unsigned_long)this);
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"K","");
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"M","");
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"B","");
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"T","");
    __l._M_len = 5;
    __l._M_array = &local_f8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_110,__l,(allocator_type *)&local_130);
    lVar15 = 0;
    do {
      if (local_68 + lVar15 != *(undefined1 **)((long)local_78 + lVar15)) {
        operator_delete(*(undefined1 **)((long)local_78 + lVar15));
      }
      lVar15 = lVar15 + -0x20;
    } while (lVar15 != -0xa0);
    auVar3 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,this);
    iVar14 = iVar14 + 3;
    uVar12 = 0;
    uVar9 = 0xfffffffffffffffd;
    do {
      uVar8 = uVar9;
      auVar17._0_8_ = auVar3._0_8_ / 1000.0;
      auVar17._8_8_ = auVar3._8_8_;
      uVar12 = uVar12 + 1;
      uVar9 = uVar8 + 3;
      iVar14 = iVar14 + -3;
      auVar3 = auVar17;
    } while (6 < iVar14);
    local_128 = 0;
    local_120[0] = 0;
    local_130 = local_120;
    if (uVar12 < (ulong)((long)local_110.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_110.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)&local_130);
    }
    else {
      __val = uVar8 + 6;
      cVar5 = '\x01';
      if (6 < uVar9) {
        uVar13 = __val;
        cVar4 = '\x04';
        do {
          cVar5 = cVar4;
          if (uVar13 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_001f7524;
          }
          if (uVar13 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_001f7524;
          }
          if (uVar13 < 10000) goto LAB_001f7524;
          bVar2 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          cVar4 = cVar5 + '\x04';
        } while (bVar2);
        cVar5 = cVar5 + '\x01';
      }
LAB_001f7524:
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,__val);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x33bb53);
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_f8.field_2._M_allocated_capacity = *psVar10;
        local_f8.field_2._8_8_ = plVar6[3];
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *psVar10;
        local_f8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_f8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_130,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
    }
    paVar1 = &__return_storage_ptr__->field_2;
    if (iVar14 == 5) {
      snprintf((char *)&local_f8,0x32,"%2.1f%s",auVar17._0_8_,local_130);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      sVar7 = strlen((char *)&local_f8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,&local_f8,(long)&local_f8._M_dataplus._M_p + sVar7
                );
    }
    else if (iVar14 == 4) {
      snprintf((char *)&local_f8,0x32,"%2.2f%s",auVar17._0_8_,local_130);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      sVar7 = strlen((char *)&local_f8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,&local_f8,(long)&local_f8._M_dataplus._M_p + sVar7
                );
    }
    else {
      snprintf((char *)&local_f8,0x32,"%2.0f%s",auVar17._0_8_,local_130);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      sVar7 = strlen((char *)&local_f8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,&local_f8,(long)&local_f8._M_dataplus._M_p + sVar7
                );
    }
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string prettyPrintCount(size_t count) {

  int nDigits = 1;
  if (count > 0) {
    nDigits = 1 + std::floor(std::log10(count));
  }

  // Print small values exactly
  if (nDigits <= 4) {
    return std::to_string(count);
  }

  std::vector<std::string> postFixes = {"", "K", "M", "B", "T"};
  size_t iPostfix = 0;
  size_t iPow = 0;
  double countD = count;

  while (nDigits > 3) {
    count /= 1000;
    countD /= 1000;
    iPostfix++;
    iPow += 3;
    nDigits -= 3;
  }

  // Get a postfix, either as a predefined character or scientific notation
  std::string postfix;
  if (iPostfix < postFixes.size()) {
    postfix = postFixes[iPostfix];
  } else {
    postfix = "*10^" + std::to_string(iPow);
  }

  // Build the actual string
  char buf[50];
  if (nDigits == 1) {
    snprintf(buf, 50, "%2.2f%s", countD, postfix.c_str());
    return std::string(buf);
  } else if (nDigits == 2) {
    snprintf(buf, 50, "%2.1f%s", countD, postfix.c_str());
    return std::string(buf);
  } else /*(nDigits == 3) */ {
    snprintf(buf, 50, "%2.0f%s", countD, postfix.c_str());
    return std::string(buf);
  }
}